

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void soplex::MPSreadName(MPSInput *mps,SPxOut *spxout)

{
  bool bVar1;
  int iVar2;
  SPxOut *pSVar3;
  char *pcVar4;
  Verbosity old_verbosity;
  
  bVar1 = MPSInput::readLine(mps);
  if (((bVar1) && (mps->m_f0 != (char *)0x0)) && (iVar2 = strcmp(mps->m_f0,"NAME"), iVar2 == 0)) {
    pcVar4 = "_MPS_";
    if (mps->m_f1 != (char *)0x0) {
      pcVar4 = mps->m_f1;
    }
    MPSInput::setProbName(mps,pcVar4);
    if ((spxout != (SPxOut *)0x0) && (3 < (int)spxout->m_verbosity)) {
      old_verbosity = spxout->m_verbosity;
      (*spxout->_vptr_SPxOut[2])(spxout);
      pSVar3 = operator<<(spxout,"IMPSRD01 Problem name   : ");
      pSVar3 = operator<<(pSVar3,mps->m_probname);
      std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
      (*spxout->_vptr_SPxOut[2])(spxout,&old_verbosity);
    }
    bVar1 = MPSInput::readLine(mps);
    if ((bVar1) && (pcVar4 = mps->m_f0, pcVar4 != (char *)0x0)) {
      iVar2 = strcmp(pcVar4,"ROWS");
      if (iVar2 == 0) {
        mps->m_section = ROWS;
        return;
      }
      iVar2 = strncmp(pcVar4,"OBJSEN",6);
      if (iVar2 == 0) {
        mps->m_section = OBJSEN;
        return;
      }
      iVar2 = strcmp(pcVar4,"OBJNAME");
      if (iVar2 == 0) {
        mps->m_section = OBJNAME;
        return;
      }
    }
  }
  MPSInput::syntaxError(mps);
  return;
}

Assistant:

static inline void MPSreadName(MPSInput& mps, SPxOut* spxout)
{
   do
   {
      // This has to be the Line with the NAME section.
      if(!mps.readLine() || (mps.field0() == nullptr) || strcmp(mps.field0(), "NAME"))
         break;

      // Sometimes the name is omitted.
      mps.setProbName((mps.field1() == nullptr) ? "_MPS_" : mps.field1());

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD01 Problem name   : " << mps.probName() << std::endl;)

      // This has to be a new section
      if(!mps.readLine() || (mps.field0() == nullptr))
         break;

      if(!strcmp(mps.field0(), "ROWS"))
         mps.setSection(MPSInput::ROWS);
      else if(!strncmp(mps.field0(), "OBJSEN", 6))
         mps.setSection(MPSInput::OBJSEN);
      else if(!strcmp(mps.field0(), "OBJNAME"))
         mps.setSection(MPSInput::OBJNAME);
      else
         break;

      return;
   }
   while(false);

   mps.syntaxError();
}